

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlNodeSetContentLen(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlElementType xVar1;
  xmlDictPtr dict;
  int iVar2;
  xmlChar *pxVar3;
  xmlNodePtr pxVar4;
  xmlNodePtr pxVar5;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (XML_NOTATION_NODE < xVar1) {
    return;
  }
  if ((0x11f8U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    if ((0x806U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      return;
    }
    if (cur->children != (xmlNodePtr)0x0) {
      xmlFreeNodeList(cur->children);
    }
    pxVar4 = xmlStringLenGetNodeList(cur->doc,content,len);
    cur->children = pxVar4;
    if (pxVar4 != (xmlNodePtr)0x0) {
      do {
        pxVar5 = pxVar4;
        pxVar5->parent = cur;
        pxVar4 = pxVar5->next;
      } while (pxVar5->next != (_xmlNode *)0x0);
      cur->last = pxVar5;
      return;
    }
    cur->last = (_xmlNode *)0x0;
    return;
  }
  pxVar3 = cur->content;
  if ((_xmlAttr **)pxVar3 != &cur->properties && pxVar3 != (xmlChar *)0x0) {
    if ((cur->doc != (_xmlDoc *)0x0) && (dict = cur->doc->dict, dict != (xmlDictPtr)0x0)) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 != 0) goto LAB_00182406;
      pxVar3 = cur->content;
    }
    (*xmlFree)(pxVar3);
  }
LAB_00182406:
  if (cur->children != (xmlNodePtr)0x0) {
    xmlFreeNodeList(cur->children);
  }
  cur->children = (_xmlNode *)0x0;
  cur->last = (_xmlNode *)0x0;
  if (content == (xmlChar *)0x0) {
    pxVar3 = (xmlChar *)0x0;
  }
  else {
    pxVar3 = xmlStrndup(content,len);
  }
  cur->content = pxVar3;
  cur->properties = (_xmlAttr *)0x0;
  return;
}

Assistant:

void
xmlNodeSetContentLen(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeSetContentLen : node == NULL\n");
#endif
	return;
    }
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if (cur->children != NULL) xmlFreeNodeList(cur->children);
	    cur->children = xmlStringLenGetNodeList(cur->doc, content, len);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	    break;
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NOTATION_NODE:
	    if ((cur->content != NULL) &&
	        (cur->content != (xmlChar *) &(cur->properties))) {
	        if (!((cur->doc != NULL) && (cur->doc->dict != NULL) &&
		    (xmlDictOwns(cur->doc->dict, cur->content))))
		    xmlFree(cur->content);
	    }
	    if (cur->children != NULL) xmlFreeNodeList(cur->children);
	    cur->children = cur->last = NULL;
	    if (content != NULL) {
		cur->content = xmlStrndup(content, len);
	    } else
		cur->content = NULL;
	    cur->properties = NULL;
	    break;
        case XML_DOCUMENT_NODE:
        case XML_DTD_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    break;
        case XML_ELEMENT_DECL:
	    /* TODO !!! */
	    break;
        case XML_ATTRIBUTE_DECL:
	    /* TODO !!! */
	    break;
        case XML_ENTITY_DECL:
	    /* TODO !!! */
	    break;
    }
}